

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_type.c
# Opt level: O1

type_conflict
type_create(type_id id,char *name,type_impl impl,type_impl_interface_singleton singleton)

{
  int iVar1;
  type __ptr;
  size_t sVar2;
  char *__dest;
  type_interface ptVar3;
  type unaff_RBX;
  bool bVar4;
  
  iVar1 = type_id_invalid(id);
  if (name == (char *)0x0) {
    return (type_conflict)0x0;
  }
  if (iVar1 == 0) {
    return (type_conflict)0x0;
  }
  __ptr = (type)malloc(0x20);
  if (__ptr == (type)0x0) {
    bVar4 = true;
  }
  else {
    sVar2 = strlen(name);
    __dest = (char *)malloc(sVar2 + 1);
    __ptr->name = __dest;
    bVar4 = __dest != (char *)0x0;
    if (bVar4) {
      memcpy(__dest,name,sVar2 + 1);
      __ptr->id = id;
      __ptr->impl = impl;
      if (singleton == (type_impl_interface_singleton)0x0) {
        ptVar3 = (type_interface)0x0;
      }
      else {
        ptVar3 = (*singleton)();
      }
      __ptr->interface = ptVar3;
      if (((ptVar3 == (type_interface)0x0) || (ptVar3->create == (type_impl_interface_create)0x0))
         || (iVar1 = (*ptVar3->create)(__ptr,impl), iVar1 == 0)) {
        bVar4 = false;
        unaff_RBX = __ptr;
        goto LAB_0011aed3;
      }
    }
    free(__ptr);
    unaff_RBX = (type)0x0;
  }
LAB_0011aed3:
  if (bVar4) {
    return (type_conflict)0x0;
  }
  return unaff_RBX;
}

Assistant:

type type_create(type_id id, const char *name, type_impl impl, type_impl_interface_singleton singleton)
{
	if (type_id_invalid(id) != 0 && name != NULL)
	{
		type t = malloc(sizeof(struct type_type));

		if (t)
		{
			size_t name_size = strlen(name) + 1;

			t->name = malloc(sizeof(char) * name_size);

			if (t->name == NULL)
			{
				/* error */

				free(t);

				return NULL;
			}

			memcpy(t->name, name, name_size);

			t->id = id;

			t->impl = impl;

			if (singleton != NULL)
			{
				t->interface = singleton();
			}
			else
			{
				t->interface = NULL;
			}

			if (t->interface != NULL && t->interface->create != NULL)
			{
				if (t->interface->create(t, impl) == 0)
				{
					return t;
				}
			}
			else
			{
				return t;
			}

			free(t);
		}
	}

	return NULL;
}